

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testInvalidRankInconsistency(void)

{
  pointer pcVar1;
  int iVar2;
  bool bVar3;
  ModelDescription *pMVar4;
  Type *pTVar5;
  FeatureType *pFVar6;
  ArrayFeatureType *pAVar7;
  TypeUnion this;
  Type *pTVar8;
  ActivationParams *pAVar9;
  ActivationReLU *pAVar10;
  Type *pTVar11;
  ostream *poVar12;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_00;
  Result res;
  Model m;
  undefined1 local_80 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  Model local_58;
  
  CoreML::Specification::Model::Model(&local_58);
  if (local_58.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_58.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_58.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_80 + 0x10;
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"A","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  if (pTVar5->type_ == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  if (pTVar5->type_ == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  pAVar7 = (pFVar6->Type_).multiarraytype_;
  iVar2 = (pAVar7->shape_).total_size_;
  if ((pAVar7->shape_).current_size_ == iVar2) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar7->shape_,iVar2 + 1);
  }
  iVar2 = (pAVar7->shape_).current_size_;
  (pAVar7->shape_).current_size_ = iVar2 + 1;
  ((pAVar7->shape_).rep_)->elements[iVar2] = 1;
  if (local_58.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_58.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_58.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"C","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  if (pTVar5->type_ == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  if (local_58._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_58);
    local_58._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_58.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  (local_58.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  this_00 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_58.Type_.pipeline_)->models_;
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                     ((RepeatedPtrFieldBase *)this_00,(Type *)0x0);
  if (pTVar8->_oneof_case_[0] != 0x82) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar8);
    pTVar8->_oneof_case_[0] = 0x82;
    pAVar9 = (ActivationParams *)operator_new(0x20);
    CoreML::Specification::ActivationParams::ActivationParams(pAVar9);
    (pTVar8->layer_).activation_ = pAVar9;
  }
  pAVar9 = (pTVar8->layer_).activation_;
  if (pAVar9->_oneof_case_[0] != 10) {
    CoreML::Specification::ActivationParams::clear_NonlinearityType(pAVar9);
    pAVar9->_oneof_case_[0] = 10;
    pAVar10 = (ActivationReLU *)operator_new(0x18);
    CoreML::Specification::ActivationReLU::ActivationReLU(pAVar10);
    (pAVar9->NonlinearityType_).relu_ = pAVar10;
  }
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"relu1","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar8->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  CoreML::Specification::NeuralNetworkLayer::add_input(pTVar8,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(pTVar8,"B");
  pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                      (&(pTVar8->outputtensor_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pTVar11->rank_ = 1;
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                     ((RepeatedPtrFieldBase *)this_00,(Type *)0x0);
  if (pTVar8->_oneof_case_[0] != 0x82) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar8);
    pTVar8->_oneof_case_[0] = 0x82;
    pAVar9 = (ActivationParams *)operator_new(0x20);
    CoreML::Specification::ActivationParams::ActivationParams(pAVar9);
    (pTVar8->layer_).activation_ = pAVar9;
  }
  pAVar9 = (pTVar8->layer_).activation_;
  if (pAVar9->_oneof_case_[0] != 10) {
    CoreML::Specification::ActivationParams::clear_NonlinearityType(pAVar9);
    pAVar9->_oneof_case_[0] = 10;
    pAVar10 = (ActivationReLU *)operator_new(0x18);
    CoreML::Specification::ActivationReLU::ActivationReLU(pAVar10);
    (pAVar9->NonlinearityType_).relu_ = pAVar10;
  }
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"relu2","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar8->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  CoreML::Specification::NeuralNetworkLayer::add_input(pTVar8,"B");
  CoreML::Specification::NeuralNetworkLayer::add_output(pTVar8,"C");
  pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                      (&(pTVar8->inputtensor_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pTVar11->rank_ = 2;
  CoreML::validate<(MLModelType)500>((Result *)local_80,&local_58);
  bVar3 = CoreML::Result::good((Result *)local_80);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x12ce);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._8_8_ != &local_68) {
    operator_delete((void *)local_80._8_8_,local_68._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_58);
  return (uint)bVar3;
}

Assistant:

int testInvalidRankInconsistency() {
    /*
     A -> relu1 -> B -> relu2 -> C
     rank of B when output of relu1 : 1
     rank of B when input of relu2: 2 (makes the model invalid)
     */
    
    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    
    auto *out = m.mutable_description()->add_output();
    out->set_name("C");
    out->mutable_type()->mutable_multiarraytype();
    
    auto *nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);
    
    auto *l = nn->add_layers();
    (void)l->mutable_activation()->mutable_relu();
    l->set_name("relu1");
    l->add_input("A");
    l->add_output("B");
    l->add_outputtensor()->set_rank(1);
    
    auto *l2 = nn->add_layers();
    (void)l2->mutable_activation()->mutable_relu();
    l2->set_name("relu2");
    l2->add_input("B");
    l2->add_output("C");
    l2->add_inputtensor()->set_rank(2);
    
    
    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    return 0;
}